

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(void *this)

{
  StrWriter *pSVar1;
  
  pSVar1 = operator<<((StrWriter *)this,"rtr");
  return pSVar1;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ins<I> i)
{
    if constexpr (I == Instr::DBF) {

        if (style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) {
            *this << "dbf";
        } else {
            *this << "dbra";
        }

    } else {

        *this << mnemonics[(int)I];
    }

    return *this;
}